

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void anon_unknown.dwarf_1015dc8::sha256::Round
               (uint32_t a,uint32_t b,uint32_t c,uint32_t *d,uint32_t e,uint32_t f,uint32_t g,
               uint32_t *h,uint32_t k)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int *in_RCX;
  long in_FS_OFFSET;
  int *in_stack_00000010;
  uint32_t t2;
  uint32_t t1;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = *in_stack_00000010;
  uVar2 = Sigma1(in_stack_ffffffffffffffbc);
  uVar3 = Ch(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  iVar4 = iVar4 + uVar2 + uVar3 + t2;
  uVar2 = Sigma0(in_stack_ffffffffffffffbc);
  uVar3 = Maj(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  *in_RCX = *in_RCX + iVar4;
  *in_stack_00000010 = iVar4 + uVar2 + uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Round(uint32_t a, uint32_t b, uint32_t c, uint32_t& d, uint32_t e, uint32_t f, uint32_t g, uint32_t& h, uint32_t k)
{
    uint32_t t1 = h + Sigma1(e) + Ch(e, f, g) + k;
    uint32_t t2 = Sigma0(a) + Maj(a, b, c);
    d += t1;
    h = t1 + t2;
}